

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clausePrimitive(SelectionCompiler *this)

{
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  Token local_48;
  Token local_30;
  
  pTVar1 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  if (this->itokenInfix !=
      ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) * -0x5555555555555555) {
    uVar3 = pTVar1[this->itokenInfix].tok;
  }
  if ((int)uVar3 < 0x409) {
    if ((int)uVar3 < 0x400) {
      if (uVar3 == 1) {
LAB_00238044:
        bVar2 = clauseChemObjName(this);
        return bVar2;
      }
      if (uVar3 == 2) {
        bVar2 = clauseIndex(this);
        return bVar2;
      }
    }
    else {
      if (uVar3 == 0x400) {
        tokenNext(&local_30,this);
        if (local_30.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_30.value._M_manager)(_Op_destroy,&local_30.value,(_Arg *)0x0);
          local_30.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        bVar2 = clauseOr(this);
        if (!bVar2) {
          return false;
        }
        tokenNext(&local_48,this);
        if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
          local_48.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        if (local_48.tok == 0x401) {
          return true;
        }
        bVar2 = rightParenthesisExpected(this);
        return bVar2;
      }
      if (uVar3 == 0x407) goto LAB_00238044;
    }
  }
  else if ((int)uVar3 < 0x140c) {
    if (uVar3 - 0x409 < 2) goto LAB_0023811f;
    if (uVar3 == 0x1406) {
      bVar2 = clauseWithin(this);
      return bVar2;
    }
  }
  else {
    if (uVar3 == 0x140c) goto LAB_0023811f;
    if (uVar3 == 0x140d) {
      bVar2 = clauseAlphaHull(this);
      return bVar2;
    }
  }
  if ((~uVar3 & 0x1c00) == 0) {
    bVar2 = clauseComparator(this);
    return bVar2;
  }
  if ((~uVar3 & 0x4400) != 0) {
    bVar2 = unrecognizedExpressionToken(this);
    return bVar2;
  }
LAB_0023811f:
  tokenNext(&local_48,this);
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
            (&this->ltokenPostfix,&local_48);
  if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
  }
  return true;
}

Assistant:

bool SelectionCompiler::clausePrimitive() {
    int tok = tokPeek();
    switch (tok) {
    case Token::within:
      return clauseWithin();

    case Token::alphahull:
      return clauseAlphaHull();

    case Token::asterisk:
    case Token::identifier:
      return clauseChemObjName();

    case Token::integer:
      return clauseIndex();
    default:
      if ((tok & Token::atomproperty) == Token::atomproperty) {
        return clauseComparator();
      }
      if ((tok & Token::predefinedset) != Token::predefinedset) { break; }
      // fall into the code and below and just add the token
      [[fallthrough]];
    case Token::all:
    case Token::none:
    case Token::hull:
      return addTokenToPostfix(tokenNext());
    case Token::leftparen:
      tokenNext();
      if (!clauseOr()) { return false; }
      if (tokenNext().tok != Token::rightparen) {
        return rightParenthesisExpected();
      }
      return true;
    }
    return unrecognizedExpressionToken();
  }